

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O0

void __thiscall soul::Structure::Structure(Structure *this,string *nm,void *backlink)

{
  bool bVar1;
  void *backlink_local;
  string *nm_local;
  Structure *this_local;
  
  RefCountedObject::RefCountedObject(&this->super_RefCountedObject);
  this->backlinkToASTObject = backlink;
  this->activeUseFlag = false;
  ArrayWithPreallocation<soul::Structure::Member,_8UL>::ArrayWithPreallocation(&this->members);
  std::__cxx11::string::string((string *)&this->name,(string *)nm);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map(&this->memberIndexMap);
  bVar1 = containsChar(&this->name,'#');
  checkAssertion(!bVar1,"! containsChar (name, \'#\')","Structure",0x20);
  return;
}

Assistant:

Structure::Structure (std::string nm, void* backlink)
  : backlinkToASTObject (backlink), name (std::move (nm))
{
    SOUL_ASSERT (! containsChar (name, '#'));
}